

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O3

void png_start_read_image(png_structrp png_ptr)

{
  png_byte pVar1;
  byte bVar2;
  int iVar3;
  png_bytep ppVar4;
  uint uVar5;
  uint uVar6;
  png_uint_32 pVar7;
  ulong uVar8;
  char *error_message;
  uint uVar9;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  if ((png_ptr->flags & 0x40) == 0) {
    png_init_read_transformations(png_ptr);
    if (png_ptr->interlaced == '\0') {
      png_ptr->num_rows = png_ptr->height;
      uVar9 = png_ptr->transformations;
      pVar7 = png_ptr->width;
      png_ptr->iwidth = pVar7;
    }
    else {
      uVar9 = png_ptr->transformations;
      pVar7 = png_ptr->width;
      uVar5 = png_ptr->height + 7 >> 3;
      if ((uVar9 & 2) != 0) {
        uVar5 = png_ptr->height;
      }
      png_ptr->num_rows = uVar5;
      png_ptr->iwidth =
           (~(uint)""[png_ptr->pass] + pVar7 + (uint)"\b\b\x04\x04\x02\x02\x01"[png_ptr->pass]) /
           (uint)"\b\b\x04\x04\x02\x02\x01"[png_ptr->pass];
    }
    bVar2 = png_ptr->pixel_depth;
    if (((uVar9 & 4) != 0) && (bVar2 = 8, 7 < png_ptr->bit_depth)) {
      bVar2 = png_ptr->pixel_depth;
    }
    uVar5 = (uint)bVar2;
    if ((uVar9 >> 0xc & 1) == 0) {
      if ((uVar9 >> 9 & 1) != 0) {
        png_ptr->transformations = uVar9 & 0xffffedff;
      }
    }
    else {
      pVar1 = png_ptr->color_type;
      if (pVar1 == '\0') {
        uVar6 = 8;
        if (8 < uVar5) {
          uVar6 = uVar5;
        }
        uVar5 = uVar6 << (png_ptr->num_trans != 0);
      }
      else if (pVar1 == '\x02') {
        if (png_ptr->num_trans != 0) {
          uVar5 = uVar5 * 0x15558 >> 0x10;
        }
      }
      else if (pVar1 == '\x03') {
        uVar5 = (uint)(png_ptr->num_trans != 0) * 8 + 0x18;
      }
      if ((uVar9 >> 9 & 1) != 0) {
        uVar5 = uVar5 << (png_ptr->bit_depth < 0x10);
      }
    }
    uVar9 = png_ptr->transformations;
    if ((short)uVar9 < 0) {
      if (png_ptr->color_type - 2 < 2) {
        uVar5 = (uint)(0x20 < uVar5) * 0x20 + 0x20;
      }
      else if (png_ptr->color_type == 0) {
        uVar5 = (uint)(8 < uVar5) * 0x10 + 0x10;
      }
    }
    if ((uVar9 >> 0xe & 1) != 0) {
      if ((((short)uVar9 < 0) || (((byte)(uVar9 >> 0xc) & png_ptr->num_trans != 0) != 0)) ||
         (pVar1 = png_ptr->color_type, pVar1 == '\x04')) {
        uVar5 = (uint)(0x10 < uVar5) * 0x20 + 0x20;
      }
      else if (uVar5 < 9) {
        uVar5 = (uint)(pVar1 == '\x06') * 8 + 0x18;
      }
      else {
        uVar5 = (uint)(pVar1 == '\x06') * 0x10 + 0x30;
      }
    }
    uVar6 = uVar5;
    if (((uVar9 >> 0x14 & 1) != 0) &&
       (uVar6 = (uint)png_ptr->user_transform_channels * (uint)png_ptr->user_transform_depth,
       uVar6 <= uVar5)) {
      uVar6 = uVar5;
    }
    png_ptr->maximum_pixel_depth = (png_byte)uVar6;
    png_ptr->transformed_pixel_depth = '\0';
    uVar8 = (ulong)(pVar7 + 7 & 0xfffffff8);
    if (uVar6 < 8) {
      uVar8 = uVar8 * uVar6 >> 3;
    }
    else {
      uVar8 = uVar8 * (uVar6 >> 3);
    }
    uVar8 = (uVar6 + 7 >> 3) + uVar8 + 0x31;
    if (png_ptr->old_big_row_buf_size < uVar8) {
      png_free(png_ptr,png_ptr->big_row_buf);
      png_free(png_ptr,png_ptr->big_prev_row);
      if (png_ptr->interlaced == '\0') {
        ppVar4 = (png_bytep)png_malloc(png_ptr,uVar8);
      }
      else {
        ppVar4 = (png_bytep)png_calloc(png_ptr,uVar8);
      }
      png_ptr->big_row_buf = ppVar4;
      ppVar4 = (png_bytep)png_malloc(png_ptr,uVar8);
      png_ptr->big_prev_row = ppVar4;
      png_ptr->row_buf =
           (png_bytep)(((ulong)(png_ptr->big_row_buf + 0x20) & 0xfffffffffffffff0) - 1);
      png_ptr->prev_row = (png_bytep)(((ulong)(ppVar4 + 0x20) & 0xfffffffffffffff0) - 1);
      png_ptr->old_big_row_buf_size = uVar8;
    }
    if (png_ptr->rowbytes == 0xffffffffffffffff) {
      error_message = "Row has too many bytes to allocate in memory";
    }
    else {
      memset(png_ptr->prev_row,0,png_ptr->rowbytes + 1);
      ppVar4 = png_ptr->read_buffer;
      if (ppVar4 != (png_bytep)0x0) {
        png_ptr->read_buffer = (png_bytep)0x0;
        png_ptr->read_buffer_size = 0;
        png_free(png_ptr,ppVar4);
      }
      iVar3 = png_inflate_claim(png_ptr,0x49444154);
      if (iVar3 == 0) {
        *(byte *)&png_ptr->flags = (byte)png_ptr->flags | 0x40;
        return;
      }
      error_message = (png_ptr->zstream).msg;
    }
    png_error(png_ptr,error_message);
  }
  png_app_error(png_ptr,"png_start_read_image/png_read_update_info: duplicate call");
  return;
}

Assistant:

void PNGAPI
png_start_read_image(png_structrp png_ptr)
{
   png_debug(1, "in png_start_read_image");

   if (png_ptr != NULL)
   {
      if ((png_ptr->flags & PNG_FLAG_ROW_INIT) == 0)
         png_read_start_row(png_ptr);

      /* New in 1.6.0 this avoids the bug of doing the initializations twice */
      else
         png_app_error(png_ptr,
             "png_start_read_image/png_read_update_info: duplicate call");
   }
}